

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool ON_ViewportFromRhinoView
               (view_projection projection,ON_3dPoint *rhvp_target,double rhvp_angle1,
               double rhvp_angle2,double rhvp_angle3,double rhvp_viewsize,double rhvp_cameradist,
               int screen_width,int screen_height,ON_Viewport *vp)

{
  double dVar1;
  ON_3dVector axis;
  ON_3dVector axis_00;
  ON_3dVector axis_01;
  ON_3dPoint center;
  ON_3dPoint center_00;
  ON_3dPoint center_01;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  long lVar8;
  ON_3dVector *pOVar9;
  ON_Xform *pOVar10;
  byte bVar11;
  double dVar12;
  ulong uVar13;
  double dVar14;
  double frus_near;
  ON_3dVector local_348;
  ON_3dVector local_330 [5];
  ON_Xform local_2b0;
  ON_Xform R1;
  ON_Xform RhinoRot;
  ON_Xform R3;
  ON_Xform R2;
  int iVar7;
  
  bVar11 = 0;
  if (vp->m_projection != projection) {
    vp->m_projection = (projection == perspective_view) + parallel_view;
  }
  dVar12 = 1000.0;
  dVar1 = 1000.0;
  if (0 < screen_height && 0 < screen_width) {
    dVar1 = (double)screen_height;
    dVar12 = (double)screen_width;
  }
  ON_Xform::ON_Xform(&R1);
  ON_Xform::ON_Xform(&R2);
  ON_Xform::ON_Xform(&R3);
  ON_Xform::ON_Xform(&RhinoRot);
  uVar5 = 0;
  uVar6 = 0;
  if ((((0.0 < rhvp_cameradist) && (uVar6 = uVar5, 0.0 < rhvp_viewsize)) && (1.0 <= dVar1)) &&
     (1.0 <= dVar12)) {
    axis.y = ON_3dVector::ZAxis.y;
    axis.x = ON_3dVector::ZAxis.x;
    axis.z = ON_3dVector::ZAxis.z;
    center.y = ON_3dPoint::Origin.y;
    center.x = ON_3dPoint::Origin.x;
    center.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation(&R1,rhvp_angle1,axis,center);
    axis_00.y = ON_3dVector::XAxis.y;
    axis_00.x = ON_3dVector::XAxis.x;
    axis_00.z = ON_3dVector::XAxis.z;
    center_00.y = ON_3dPoint::Origin.y;
    center_00.x = ON_3dPoint::Origin.x;
    center_00.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation(&R2,rhvp_angle2,axis_00,center_00);
    axis_01.y = ON_3dVector::ZAxis.y;
    axis_01.x = ON_3dVector::ZAxis.x;
    axis_01.z = ON_3dVector::ZAxis.z;
    center_01.y = ON_3dPoint::Origin.y;
    center_01.x = ON_3dPoint::Origin.x;
    center_01.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation(&R3,rhvp_angle3,axis_01,center_01);
    ON_Xform::operator*(&local_2b0,&R3,&R2);
    ON_Xform::operator*((ON_Xform *)local_330,&local_2b0,&R1);
    pOVar9 = local_330;
    pOVar10 = &RhinoRot;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pOVar10->m_xform[0][0] = (*(double (*) [4])&pOVar9->x)[0];
      pOVar9 = (ON_3dVector *)((long)pOVar9 + ((ulong)bVar11 * -2 + 1) * 8);
      pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar11 * -2 + 1) * 8);
    }
    ON_Xform::operator*(local_330,&RhinoRot,&ON_3dVector::YAxis);
    ON_Viewport::SetCameraUp(vp,local_330);
    ON_Xform::operator*((ON_3dVector *)&local_2b0,&RhinoRot,&ON_3dVector::ZAxis);
    ON_3dVector::operator-(local_330,(ON_3dVector *)&local_2b0);
    ON_Viewport::SetCameraDirection(vp,local_330);
    local_348.z = (vp->m_CamDir).z;
    local_348.x = (vp->m_CamDir).x;
    local_348.y = (vp->m_CamDir).y;
    operator*((ON_3dVector *)&local_2b0,rhvp_cameradist,&local_348);
    ON_3dPoint::operator-((ON_3dPoint *)local_330,rhvp_target,(ON_3dVector *)&local_2b0);
    ON_Viewport::SetCameraLocation(vp,(ON_3dPoint *)local_330);
    ON_Viewport::SetTargetPoint(vp,*rhvp_target);
    dVar14 = dVar12 * rhvp_viewsize;
    uVar13 = ~-(ulong)(dVar1 < dVar12) & (ulong)rhvp_viewsize;
    if (dVar12 <= dVar1) {
      rhvp_viewsize = (rhvp_viewsize * dVar1) / dVar12;
    }
    frus_near = 1.0;
    if (rhvp_cameradist * 0.015625 <= 1.0) {
      frus_near = rhvp_cameradist * 0.015625;
    }
    dVar14 = (double)(uVar13 | (ulong)(dVar14 / dVar1) & -(ulong)(dVar1 < dVar12));
    if (vp->m_projection == perspective_view) {
      dVar14 = dVar14 * frus_near;
      rhvp_viewsize = rhvp_viewsize * frus_near;
    }
    ON_Viewport::SetFrustum
              (vp,-dVar14,dVar14,-rhvp_viewsize,rhvp_viewsize,frus_near,rhvp_cameradist * 4.0);
    if ((int)dVar1 != 0 && (int)dVar12 != 0) {
      *(undefined4 *)((vp->m_projection_content_sha1).m_digest + 0x10) =
           ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
      uVar4 = ON_SHA1_Hash::ZeroDigest.m_digest._12_4_;
      uVar3 = ON_SHA1_Hash::ZeroDigest.m_digest._8_4_;
      uVar2 = ON_SHA1_Hash::ZeroDigest.m_digest._4_4_;
      *(undefined4 *)(vp->m_projection_content_sha1).m_digest =
           ON_SHA1_Hash::ZeroDigest.m_digest._0_4_;
      *(undefined4 *)((vp->m_projection_content_sha1).m_digest + 4) = uVar2;
      *(undefined4 *)((vp->m_projection_content_sha1).m_digest + 8) = uVar3;
      *(undefined4 *)((vp->m_projection_content_sha1).m_digest + 0xc) = uVar4;
      vp->m_port_left = 0;
      vp->m_port_right = (int)dVar12;
      vp->m_port_bottom = (int)dVar1;
      vp->m_port_top = 0;
      vp->m_port_near = 0;
      vp->m_port_far = 0xffff;
      vp->m_bValidPort = true;
    }
    iVar7 = (*(vp->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(vp,0);
    uVar6 = (undefined1)iVar7;
  }
  return (bool)uVar6;
}

Assistant:

bool ON_ViewportFromRhinoView(
        ON::view_projection projection,
        const ON_3dPoint& rhvp_target, // 3d point
        double rhvp_angle1, double rhvp_angle2, double rhvp_angle3, // radians
        double rhvp_viewsize,     // > 0
        double rhvp_cameradist,   // > 0
        int screen_width, int screen_height,
        ON_Viewport& vp
        )
/*****************************************************************************
Compute canonical view projection information from Rhino viewport settings
INPUT:
  projection
  rhvp_target
    Rhino viewport target point (3d point that is center of view rotations)
  rhvp_angle1, rhvp_angle2, rhvp_angle3
    Rhino viewport angle settings
  rhvp_viewsize 
    In perspective, rhvp_viewsize = tangent(half lens angle).
    In parallel, rhvp_viewsize = 1/2 * minimum(frustum width,frustum height)
  rhvp_cameradistance ( > 0 )
    Distance from camera location to Rhino's "target" point
  screen_width, screen_height (0,0) if not known
*****************************************************************************/
{
  vp.SetProjection( projection );
  /*
  width, height
    width and height of viewport  
    ( = RhinoViewport->width, RhinoViewport->height )
  z_buffer_depth
    depth for the z buffer.  0xFFFF is currently used for Rhino
    quick rendering.
  */

  // In the situation where there is no physical display device, assume a
  // 1000 x 1000 "screen" and set the parameters accordingly.  Toolkit users
  // that are using this class to actually draw a picture, can make a subsequent
  // call to SetScreenPort().

  const double height = (screen_width < 1 || screen_height < 1) 
                      ? 1000.0 : (double)screen_height;
  const double width  = (screen_width < 1 || screen_height < 1) 
                      ? 1000.0 : (double)screen_width;
  //const int z_buffer_depth = 0xFFFF; // value Rhino "Shade" command uses

  // Use this function to obtain standard view information from a Rhino VIEWPORT
  // view. The Rhino viewport has many entries.  As of 17 October, 1997 all Rhino
  // world to clipping transformation information is derived from the VIEWPORT 
  // fields:
  //
  //   target, angle1, angle2, angle3, viewsize, and cameradist.
  //
  // The width, height and zbuffer_depth arguments are used to determine the
  // clipping to screen transformation.

  ON_Xform R1, R2, R3, RhinoRot;
  double frustum_left, frustum_right, frustum_bottom, frustum_top;
  double near_clipping_distance, far_clipping_distance;

  // Initialize default view in case input is garbage.
  if (height < 1)
    return false;
  if ( width < 1 )
    return false;
  if ( rhvp_viewsize <= 0.0 )
    return false;
  if ( rhvp_cameradist <= 0.0 )
    return false;

  // A Rhino 1.0 VIEWPORT structure describes the camera's location, direction,
  // and  orientation by specifying a rotation transformation that is
  // applied to an initial frame.  The rotation transformation is defined
  // as a sequence of 3 rotations abount fixed axes.  The initial frame
  // has the camera located at (0,0,cameradist), pointed in the direction
  // (0,0,-1), and oriented so that up is (0,1,0).

  R1.Rotation( rhvp_angle1, ON_3dVector::ZAxis, ON_3dPoint::Origin ); // so called "twist"
  R2.Rotation( rhvp_angle2, ON_3dVector::XAxis, ON_3dPoint::Origin ); // so called "elevation"
  R3.Rotation( rhvp_angle3, ON_3dVector::ZAxis, ON_3dPoint::Origin ); // so called "fudge factor"
  RhinoRot = R3 * R2 * R1;

  vp.SetCameraUp( RhinoRot*ON_3dVector::YAxis );
  vp.SetCameraDirection( -(RhinoRot*ON_3dVector::ZAxis) );
  vp.SetCameraLocation( rhvp_target - rhvp_cameradist*vp.CameraDirection() );
  vp.SetTargetPoint( rhvp_target );
  //vp.SetTargetDistance( rhvp_cameradist );

  // Camera coordinates "X" = CameraRight = CameraDirection x CameraUp
  // Camera coordinates "Y" = CameraUp
  // Camera coordinates "Z" = -CameraDirection

  // Rhino 1.0 did not support skew projections.  In other words, the
  // view frustum is symmetric and ray that begins at CameraLocation and 
  // goes along CameraDirection runs along the frustum's central axis.
  // The aspect ratio of the view frustum equals 
  // (screen port width)/(screen port height)
  // This means frus_left = -frus_right, frus_bottom = -frus_top, and
  // frus_top/frus_right = height/width

  // Set near and far clipping planes to some reasonable values.  If
  // the depth of the pixel is important, then the near and far clipping
  // plane will need to be adjusted later.
  // Rhino 1.0 didn't have a far clipping plane in wire frame (which explains
  // why you can get perspective views reversed through the origin by using 
  // the SetCameraTarget() command.  It's near clipping plane is set to 
  // a minuscule value.  For mesh rendering, it must come up with some
  // sort of reasonable near and far clipping planes because the zbuffer
  // is used correctly.  When time permits, I'll dig through the rendering
  // code and determine what values are being used.
  //
  near_clipping_distance = rhvp_cameradist/64.0;
  if ( near_clipping_distance > 1.0 )
    near_clipping_distance = 1.0;
  far_clipping_distance = 4.0*rhvp_cameradist;


  if ( width <= height )
  {
    frustum_right = rhvp_viewsize;
    frustum_top = frustum_right*height/width;
  }
  else
  {
    frustum_top = rhvp_viewsize;
    frustum_right = frustum_top*width/height;
  }
  if ( vp.IsPerspectiveProjection() )
  {
    frustum_right *= near_clipping_distance;
    frustum_top   *= near_clipping_distance;
  }
  frustum_left   = -frustum_right;
  frustum_bottom = -frustum_top;


  vp.SetFrustum( 
         frustum_left,   frustum_right, 
         frustum_bottom, frustum_top, 
         near_clipping_distance, far_clipping_distance );

  // Windows specific stuff that requires knowing size of client area in pixels
  vp.SetScreenPort( 0, (int)width, // windows has screen X increasing accross
                    (int)height,  0, // windows has screen Y increasing downwards
                    0, 0xFFFF );

  return (vp.IsValid()?true:false);
}